

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterMeshless.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChMatterMeshless::VariablesQbSetSpeed(ChMatterMeshless *this,double step)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  element_type *peVar6;
  pointer psVar7;
  uint uVar8;
  ulong uVar9;
  double dVar10;
  double oos;
  ChVector<double> local_60;
  MatrixBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  local_48 [24];
  
  psVar7 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->nodes).
      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar7) {
    dVar10 = 1.0 / step;
    uVar8 = 1;
    uVar9 = 0;
    do {
      peVar6 = psVar7[uVar9].
               super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      dVar1 = (peVar6->super_ChNodeXYZ).pos_dt.m_data[0];
      dVar2 = (peVar6->super_ChNodeXYZ).pos_dt.m_data[1];
      dVar3 = (peVar6->super_ChNodeXYZ).pos_dt.m_data[2];
      ChVariables::Get_qb((ChVectorRef *)local_48,
                          &((psVar7[uVar9].
                             super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->variables).super_ChVariables);
      ChVector<double>::
      ChVector<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
                (&local_60,local_48,(type *)0x0);
      if (&(peVar6->super_ChNodeXYZ).pos_dt != &local_60) {
        (peVar6->super_ChNodeXYZ).pos_dt.m_data[0] = local_60.m_data[0];
        (peVar6->super_ChNodeXYZ).pos_dt.m_data[1] = local_60.m_data[1];
        (peVar6->super_ChNodeXYZ).pos_dt.m_data[2] = local_60.m_data[2];
      }
      if ((step != 0.0) || (NAN(step))) {
        peVar6 = (this->nodes).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar9].
                 super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        dVar4 = *(double *)((long)&peVar6->super_ChNodeXYZ + 0x30);
        dVar5 = *(double *)((long)&peVar6->super_ChNodeXYZ + 0x28);
        ((ChVector<double> *)((long)&peVar6->super_ChNodeXYZ + 0x38))->m_data[0] =
             dVar10 * (((ChVector<double> *)((long)&peVar6->super_ChNodeXYZ + 0x20))->m_data[0] -
                      dVar1);
        *(double *)((long)&peVar6->super_ChNodeXYZ + 0x40) = dVar10 * (dVar5 - dVar2);
        *(double *)((long)&peVar6->super_ChNodeXYZ + 0x48) = dVar10 * (dVar4 - dVar3);
      }
      uVar9 = (ulong)uVar8;
      psVar7 = (this->nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = uVar8 + 1;
    } while (uVar9 < (ulong)((long)(this->nodes).
                                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar7 >> 4));
  }
  return;
}

Assistant:

void ChMatterMeshless::VariablesQbSetSpeed(double step) {
    for (unsigned int j = 0; j < nodes.size(); j++) {
        ChVector<> old_pos_dt = nodes[j]->GetPos_dt();

        // from 'qb' vector, sets body speed, and updates auxiliary data
        nodes[j]->SetPos_dt(nodes[j]->variables.Get_qb());

        // Compute accel. by BDF (approximate by differentiation);
        if (step) {
            nodes[j]->SetPos_dtdt((nodes[j]->GetPos_dt() - old_pos_dt) / step);
        }
    }
}